

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3UpsertNextIsIPK(Upsert *pUpsert)

{
  Upsert *pUVar1;
  Upsert *pNext;
  Upsert *pUpsert_local;
  
  if (pUpsert == (Upsert *)0x0) {
    pUpsert_local._4_4_ = 0;
  }
  else {
    pUVar1 = pUpsert->pNextUpsert;
    if (pUVar1 == (Upsert *)0x0) {
      pUpsert_local._4_4_ = 1;
    }
    else if (pUVar1->pUpsertTarget == (ExprList *)0x0) {
      pUpsert_local._4_4_ = 1;
    }
    else if (pUVar1->pUpsertIdx == (Index *)0x0) {
      pUpsert_local._4_4_ = 1;
    }
    else {
      pUpsert_local._4_4_ = 0;
    }
  }
  return pUpsert_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3UpsertNextIsIPK(Upsert *pUpsert){
  Upsert *pNext;
  if( NEVER(pUpsert==0) ) return 0;
  pNext = pUpsert->pNextUpsert;
  if( pNext==0 ) return 1;
  if( pNext->pUpsertTarget==0 ) return 1;
  if( pNext->pUpsertIdx==0 ) return 1;
  return 0;
}